

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O3

int demo_choice_proc(DEMO_MENU *item,int msg,int extra)

{
  long *plVar1;
  long lVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  undefined4 uVar15;
  float fVar16;
  undefined4 uVar17;
  float fVar18;
  undefined4 uVar19;
  undefined4 in_XMM1_Da;
  
  lVar12 = -1;
  iVar14 = -2;
  do {
    iVar14 = iVar14 + 1;
    lVar2 = lVar12 + 1;
    lVar12 = lVar12 + 1;
  } while (item->data[lVar2] != (void *)0x0);
  if (msg == 3) {
    _Var3 = key_pressed(0x52);
    if ((_Var3) && (0 < item->extra)) {
      item->extra = item->extra + -1;
      play_sound_id(7,0xff,0x80,-100,0);
      if (item->on_activate != (_func_void_DEMO_MENU_ptr *)0x0) {
        (*item->on_activate)(item);
      }
    }
    _Var3 = key_pressed(0x53);
    if (!_Var3) {
      return 1000;
    }
    if (iVar14 <= item->extra) {
      return 1000;
    }
    iVar6 = item->extra + 1;
  }
  else {
    iVar6 = screen_width / 6;
    iVar7 = (int)lVar12;
    if (msg == 1) {
      if (lVar12 == 0) {
        return 1000;
      }
      uVar15 = al_map_rgb(0xff,0xff,(((uint)item->flags >> 1 & 1) != 0) + -1);
      iVar11 = (screen_width - iVar6) / 2;
      uVar19 = in_XMM1_Da;
      shadow_textprintf((ALLEGRO_FONT *)demo_data[1].dat,iVar11 + -8,extra,1,(int)item->name,uVar15,
                        in_XMM1_Da);
      iVar4 = al_get_font_line_height(demo_data[1].dat);
      iVar5 = iVar4 / 2;
      if (iVar4 / 2 < 9) {
        iVar5 = 8;
      }
      iVar4 = al_get_font_line_height(demo_data[1].dat);
      iVar8 = (iVar4 - iVar5) / 2;
      iVar9 = shadow_offset + iVar11;
      iVar13 = iVar8 + extra;
      fVar16 = (float)(iVar13 + shadow_offset);
      iVar10 = iVar11 + iVar6 + shadow_offset;
      iVar4 = shadow_offset + iVar13 + iVar5;
      uVar17 = al_map_rgb(0,0,0);
      al_draw_rectangle((float)iVar9,fVar16,(float)iVar10,(float)iVar4,uVar17,uVar19,0x3f800000);
      iVar9 = iVar6 + -4;
      iVar4 = 8;
      if (8 < iVar9 / iVar7) {
        iVar4 = iVar9 / iVar7;
      }
      iVar7 = (item->extra * iVar9) / iVar7;
      iVar10 = iVar9 - iVar4;
      if (iVar7 + iVar4 <= iVar9) {
        iVar10 = iVar7;
      }
      iVar7 = iVar9 - iVar10;
      if (item->extra != iVar14) {
        iVar7 = iVar4;
      }
      fVar18 = (float)(iVar13 + iVar5);
      uVar19 = al_map_rgb(0,0,0);
      al_draw_filled_rectangle
                ((float)(iVar11 + iVar10 + 3),(float)(iVar8 + 3 + extra),
                 (float)(iVar7 + 3 + iVar10 + iVar11),fVar18,uVar19,fVar16);
      al_draw_rectangle((float)iVar11,(float)iVar13,(float)(iVar11 + iVar6),fVar18,uVar15,in_XMM1_Da
                        ,0x3f800000);
      al_draw_filled_rectangle
                ((float)(iVar11 + iVar10 + 2),(float)(iVar8 + 2 + extra),
                 (float)(iVar7 + 2 + iVar10 + iVar11),(float)(iVar5 + -2 + iVar13),uVar15,in_XMM1_Da
                );
      shadow_textprintf((ALLEGRO_FONT *)demo_data[1].dat,iVar11 + 8 + iVar6,extra,0,
                        (int)item->data[item->extra],uVar15,in_XMM1_Da);
      return 1000;
    }
    if (extra != 0xd || msg != 2) {
      if (msg == 5) {
        iVar14 = al_get_font_line_height(demo_data[1].dat);
        return iVar14 + 8;
      }
      if (msg != 4) {
        return 1000;
      }
      iVar14 = al_get_text_width(demo_data[1].dat,item->name);
      if (*item->data != (void *)0x0) {
        lVar12 = 8;
        do {
          iVar7 = al_get_text_width(demo_data[1].dat);
          if (iVar14 < iVar7) {
            iVar14 = iVar7;
          }
          plVar1 = (long *)((long)item->data + lVar12);
          lVar12 = lVar12 + 8;
        } while (*plVar1 != 0);
      }
      iVar7 = al_get_text_width(demo_data[1].dat,item->name);
      if (iVar14 < iVar7) {
        iVar14 = al_get_text_width(demo_data[1].dat,item->name);
      }
      return iVar6 + 0x10 + iVar14 * 2;
    }
    _Var3 = mouse_button_pressed(1);
    if (!_Var3) {
      return 1000;
    }
    iVar14 = screen_width - iVar6;
    iVar5 = mouse_x();
    iVar6 = ((iVar5 - iVar14 / 2) * iVar7) / iVar6;
  }
  item->extra = iVar6;
  play_sound_id(7,0xff,0x80,-100,0);
  if (item->on_activate != (_func_void_DEMO_MENU_ptr *)0x0) {
    (*item->on_activate)(item);
  }
  return 1000;
}

Assistant:

int demo_choice_proc(DEMO_MENU * item, int msg, int extra)
{
   int x, cw, ch, dy, cx;
   int choice_count = 0;
   int slider_width = screen_width / 6;
   int i, tmp;
   ALLEGRO_COLOR col;

   /* count number of choices */
   for (; item->data[choice_count] != 0; choice_count++);

   if (msg == DEMO_MENU_MSG_DRAW) {
      if (!choice_count) return DEMO_MENU_CONTINUE;
      if (item->flags & DEMO_MENU_SELECTED) {
         col = al_map_rgb(255, 255, 0);
      } else {
         col = al_map_rgb(255, 255, 255);
      }

      /* starting position */
      x = (screen_width - slider_width) / 2;

      /* print name of the item */
      shadow_textprintf(demo_font, x - 8, extra, col, 1,
                      item->name);

      /* draw slider thingy */
      ch = al_get_font_line_height(demo_font) / 2;
      ch = MAX(8, ch);
      dy = (al_get_font_line_height(demo_font) - ch) / 2;

      /* shadow */
      al_draw_rectangle(x + shadow_offset,
           extra + dy + shadow_offset,
           x + slider_width + shadow_offset, extra + dy + ch + shadow_offset,
           al_map_rgb(0, 0, 0), 1);
      cw = (slider_width - 4) / choice_count;
      cw = MAX(cw, 8);
      cx = (slider_width - 4) * item->extra / choice_count;
      if (cx + cw > slider_width - 4) {
         cx = slider_width - 4 - cw;
      }
      if (item->extra == choice_count - 1) {
         cw = slider_width - 4 - cx;
      }
      al_draw_filled_rectangle(x + 3 + cx, extra + dy + 3,
               x + 3 + cx + cw, extra + dy + ch, al_map_rgb(0, 0, 0));

      /* slider */
      al_draw_rectangle(x, extra + dy, x + slider_width, extra + dy + ch,
           col, 1);
      al_draw_filled_rectangle(x + 2 + cx, extra + dy + 2, x + 2 + cx + cw,
               extra + dy + ch - 2, col);

      x += slider_width;

      /* print selected choice */
      shadow_textprintf(demo_font, x + 8, extra, col,
                      0, (char *)(item->data)[item->extra]);
   } else if (msg == DEMO_MENU_MSG_KEY) {
      if (key_pressed(ALLEGRO_KEY_LEFT)) {
         if (item->extra > 0) {
            --item->extra;
            play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);

            if (item->on_activate) {
               item->on_activate(item);
            }
         }
      }
            
      if (key_pressed(ALLEGRO_KEY_RIGHT)) {
         if (item->extra < choice_count - 1) {
            ++item->extra;
            play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);

            if (item->on_activate) {
               item->on_activate(item);
            }
         }
      }
   } else if (msg == DEMO_MENU_MSG_CHAR && extra == 13) {
      if (mouse_button_pressed(1)) {
         x = (screen_width - slider_width) / 2;
         item->extra = (mouse_x() - x) * choice_count / slider_width;
         play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);
         if (item->on_activate) {
            item->on_activate(item);
         }
      }
   } else if (msg == DEMO_MENU_MSG_WIDTH) {
      cw = al_get_text_width(demo_font, item->name);
      for (i = 0; item->data[i] != 0; i++) {
         tmp = al_get_text_width(demo_font, (char *)(item->data)[i]);
         if (tmp > cw) {
            cw = tmp;
         }
      }

      return MAX(al_get_text_width(demo_font, item->name),
                 cw) * 2 + slider_width + 2 * 8;
   } else if (msg == DEMO_MENU_MSG_HEIGHT) {
      return demo_text_proc(item, msg, extra);
   }

   return DEMO_MENU_CONTINUE;
}